

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O1

TestCaseGroup * vkt::compute::createIndirectComputeDispatchTests(TestContext *testCtx)

{
  int iVar1;
  TestNode *this;
  TestNode *pTVar2;
  IndirectDispatchCaseBufferUpload *pIVar3;
  char *pcVar4;
  long lVar5;
  DispatchCommandsVec local_2d0;
  DispatchCommandsVec local_2b8;
  DispatchCommandsVec local_2a0;
  DispatchCommandsVec local_288;
  DispatchCommandsVec local_270;
  DispatchCommandsVec local_258;
  DispatchCommandsVec local_240;
  DispatchCommandsVec local_228;
  DispatchCommandsVec local_210;
  DispatchCommand local_1f8;
  DispatchCommand local_1e0;
  DispatchCommand local_1c8;
  DispatchCommand local_1b0;
  DispatchCommand local_198;
  DispatchCommand local_180;
  DispatchCommand local_168;
  DispatchCommand local_150;
  DispatchCommand local_138;
  DispatchCommand local_120;
  DispatchCommand local_108;
  DispatchCommand local_f0;
  DispatchCommand local_d8;
  DispatchCommand local_c0;
  DispatchCommand local_a8;
  DispatchCommand local_90;
  DispatchCommand local_78;
  DispatchCommand local_60;
  DispatchCommand local_48;
  
  if (createIndirectComputeDispatchTests(tcu::TestContext&)::s_dispatchCases == '\0') {
    iVar1 = __cxa_guard_acquire(&createIndirectComputeDispatchTests(tcu::TestContext&)::
                                 s_dispatchCases);
    if (iVar1 != 0) {
      local_48.m_offset = 0;
      local_48.m_numWorkGroups.m_data[0] = 1;
      local_48.m_numWorkGroups.m_data[1] = 1;
      local_48.m_numWorkGroups.m_data[2] = 1;
      anon_unknown_1::commandsVec(&local_210,&local_48);
      createIndirectComputeDispatchTests::s_dispatchCases[0].m_name = "single_invocation";
      createIndirectComputeDispatchTests::s_dispatchCases[0].m_description =
           "Single invocation only from offset 0";
      createIndirectComputeDispatchTests::s_dispatchCases[0].m_bufferSize = 0xc;
      createIndirectComputeDispatchTests::s_dispatchCases[0].m_workGroupSize.m_data[0] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[0].m_workGroupSize.m_data[1] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[0].m_workGroupSize.m_data[2] = 1;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[0].m_dispatchCommands,&local_210
              );
      local_60.m_offset = 0;
      local_60.m_numWorkGroups.m_data[0] = 2;
      local_60.m_numWorkGroups.m_data[1] = 3;
      local_60.m_numWorkGroups.m_data[2] = 5;
      anon_unknown_1::commandsVec(&local_228,&local_60);
      createIndirectComputeDispatchTests::s_dispatchCases[1].m_name = "multiple_groups";
      createIndirectComputeDispatchTests::s_dispatchCases[1].m_description =
           "Multiple groups dispatched from offset 0";
      createIndirectComputeDispatchTests::s_dispatchCases[1].m_bufferSize = 0xc;
      createIndirectComputeDispatchTests::s_dispatchCases[1].m_workGroupSize.m_data[0] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[1].m_workGroupSize.m_data[1] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[1].m_workGroupSize.m_data[2] = 1;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[1].m_dispatchCommands,&local_228
              );
      local_78.m_offset = 0;
      local_78.m_numWorkGroups.m_data[0] = 1;
      local_78.m_numWorkGroups.m_data[1] = 2;
      local_78.m_numWorkGroups.m_data[2] = 3;
      anon_unknown_1::commandsVec(&local_240,&local_78);
      createIndirectComputeDispatchTests::s_dispatchCases[2].m_name =
           "multiple_groups_multiple_invocations";
      createIndirectComputeDispatchTests::s_dispatchCases[2].m_description =
           "Multiple groups of size 2x3x1 from offset 0";
      createIndirectComputeDispatchTests::s_dispatchCases[2].m_bufferSize = 0xc;
      createIndirectComputeDispatchTests::s_dispatchCases[2].m_workGroupSize.m_data[0] = 2;
      createIndirectComputeDispatchTests::s_dispatchCases[2].m_workGroupSize.m_data[1] = 3;
      createIndirectComputeDispatchTests::s_dispatchCases[2].m_workGroupSize.m_data[2] = 1;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[2].m_dispatchCommands,&local_240
              );
      local_90.m_offset = 0x10;
      local_90.m_numWorkGroups.m_data[0] = 1;
      local_90.m_numWorkGroups.m_data[1] = 1;
      local_90.m_numWorkGroups.m_data[2] = 1;
      anon_unknown_1::commandsVec(&local_258,&local_90);
      createIndirectComputeDispatchTests::s_dispatchCases[3].m_name = "small_offset";
      createIndirectComputeDispatchTests::s_dispatchCases[3].m_description = "Small offset";
      createIndirectComputeDispatchTests::s_dispatchCases[3].m_bufferSize = 0x1c;
      createIndirectComputeDispatchTests::s_dispatchCases[3].m_workGroupSize.m_data[0] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[3].m_workGroupSize.m_data[1] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[3].m_workGroupSize.m_data[2] = 1;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[3].m_dispatchCommands,&local_258
              );
      local_a8.m_offset = 0x10000c;
      local_a8.m_numWorkGroups.m_data[0] = 1;
      local_a8.m_numWorkGroups.m_data[1] = 1;
      local_a8.m_numWorkGroups.m_data[2] = 1;
      anon_unknown_1::commandsVec(&local_270,&local_a8);
      createIndirectComputeDispatchTests::s_dispatchCases[4].m_name = "large_offset";
      createIndirectComputeDispatchTests::s_dispatchCases[4].m_description = "Large offset";
      createIndirectComputeDispatchTests::s_dispatchCases[4].m_bufferSize = 0x200000;
      createIndirectComputeDispatchTests::s_dispatchCases[4].m_workGroupSize.m_data[0] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[4].m_workGroupSize.m_data[1] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[4].m_workGroupSize.m_data[2] = 1;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[4].m_dispatchCommands,&local_270
              );
      local_c0.m_offset = 0x10000c;
      local_c0.m_numWorkGroups.m_data[0] = 1;
      local_c0.m_numWorkGroups.m_data[1] = 2;
      local_c0.m_numWorkGroups.m_data[2] = 3;
      anon_unknown_1::commandsVec(&local_288,&local_c0);
      createIndirectComputeDispatchTests::s_dispatchCases[5].m_name =
           "large_offset_multiple_invocations";
      createIndirectComputeDispatchTests::s_dispatchCases[5].m_description =
           "Large offset, multiple invocations";
      createIndirectComputeDispatchTests::s_dispatchCases[5].m_bufferSize = 0x200000;
      createIndirectComputeDispatchTests::s_dispatchCases[5].m_workGroupSize.m_data[0] = 2;
      createIndirectComputeDispatchTests::s_dispatchCases[5].m_workGroupSize.m_data[1] = 3;
      createIndirectComputeDispatchTests::s_dispatchCases[5].m_workGroupSize.m_data[2] = 1;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[5].m_dispatchCommands,&local_288
              );
      local_1f8.m_offset = 0;
      local_1f8.m_numWorkGroups.m_data[0] = 0;
      local_1f8.m_numWorkGroups.m_data[1] = 0;
      local_1f8.m_numWorkGroups.m_data[2] = 0;
      anon_unknown_1::commandsVec(&local_2a0,&local_1f8);
      createIndirectComputeDispatchTests::s_dispatchCases[6].m_name = "empty_command";
      createIndirectComputeDispatchTests::s_dispatchCases[6].m_description = "Empty command";
      createIndirectComputeDispatchTests::s_dispatchCases[6].m_bufferSize = 0xc;
      createIndirectComputeDispatchTests::s_dispatchCases[6].m_workGroupSize.m_data[0] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[6].m_workGroupSize.m_data[1] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[6].m_workGroupSize.m_data[2] = 1;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[6].m_dispatchCommands,&local_2a0
              );
      local_d8.m_offset = 0;
      local_d8.m_numWorkGroups.m_data[0] = 1;
      local_d8.m_numWorkGroups.m_data[1] = 1;
      local_d8.m_numWorkGroups.m_data[2] = 1;
      local_f0.m_offset = 0xc;
      local_f0.m_numWorkGroups.m_data[0] = 2;
      local_f0.m_numWorkGroups.m_data[1] = 1;
      local_f0.m_numWorkGroups.m_data[2] = 1;
      local_108.m_offset = 0x68;
      local_108.m_numWorkGroups.m_data[0] = 1;
      local_108.m_numWorkGroups.m_data[1] = 3;
      local_108.m_numWorkGroups.m_data[2] = 1;
      local_120.m_offset = 0x28;
      local_120.m_numWorkGroups.m_data[0] = 1;
      local_120.m_numWorkGroups.m_data[1] = 1;
      local_120.m_numWorkGroups.m_data[2] = 7;
      local_138.m_offset = 0x34;
      local_138.m_numWorkGroups.m_data[0] = 1;
      local_138.m_numWorkGroups.m_data[1] = 1;
      local_138.m_numWorkGroups.m_data[2] = 4;
      anon_unknown_1::commandsVec(&local_2b8,&local_d8,&local_f0,&local_108,&local_120,&local_138);
      createIndirectComputeDispatchTests::s_dispatchCases[7].m_name = "multi_dispatch";
      createIndirectComputeDispatchTests::s_dispatchCases[7].m_description =
           "Dispatch multiple compute commands from single buffer";
      createIndirectComputeDispatchTests::s_dispatchCases[7].m_bufferSize = 0x400;
      createIndirectComputeDispatchTests::s_dispatchCases[7].m_workGroupSize.m_data[0] = 3;
      createIndirectComputeDispatchTests::s_dispatchCases[7].m_workGroupSize.m_data[1] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[7].m_workGroupSize.m_data[2] = 2;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[7].m_dispatchCommands,&local_2b8
              );
      local_150.m_offset = 0;
      local_150.m_numWorkGroups.m_data[0] = 1;
      local_150.m_numWorkGroups.m_data[1] = 1;
      local_150.m_numWorkGroups.m_data[2] = 1;
      local_168.m_offset = 0;
      local_168.m_numWorkGroups.m_data[0] = 1;
      local_168.m_numWorkGroups.m_data[1] = 1;
      local_168.m_numWorkGroups.m_data[2] = 1;
      local_180.m_offset = 0;
      local_180.m_numWorkGroups.m_data[0] = 1;
      local_180.m_numWorkGroups.m_data[1] = 1;
      local_180.m_numWorkGroups.m_data[2] = 1;
      local_198.m_offset = 0x68;
      local_198.m_numWorkGroups.m_data[0] = 1;
      local_198.m_numWorkGroups.m_data[1] = 3;
      local_198.m_numWorkGroups.m_data[2] = 1;
      local_1b0.m_offset = 0x68;
      local_1b0.m_numWorkGroups.m_data[0] = 1;
      local_1b0.m_numWorkGroups.m_data[1] = 3;
      local_1b0.m_numWorkGroups.m_data[2] = 1;
      local_1c8.m_offset = 0x34;
      local_1c8.m_numWorkGroups.m_data[0] = 1;
      local_1c8.m_numWorkGroups.m_data[1] = 1;
      local_1c8.m_numWorkGroups.m_data[2] = 4;
      local_1e0.m_offset = 0x34;
      local_1e0.m_numWorkGroups.m_data[0] = 1;
      local_1e0.m_numWorkGroups.m_data[1] = 1;
      local_1e0.m_numWorkGroups.m_data[2] = 4;
      anon_unknown_1::commandsVec
                (&local_2d0,&local_150,&local_168,&local_180,&local_198,&local_1b0,&local_1c8,
                 &local_1e0);
      createIndirectComputeDispatchTests::s_dispatchCases[8].m_name = "multi_dispatch_reuse_command"
      ;
      createIndirectComputeDispatchTests::s_dispatchCases[8].m_description =
           "Dispatch multiple compute commands from single buffer";
      createIndirectComputeDispatchTests::s_dispatchCases[8].m_bufferSize = 0x400;
      createIndirectComputeDispatchTests::s_dispatchCases[8].m_workGroupSize.m_data[0] = 3;
      createIndirectComputeDispatchTests::s_dispatchCases[8].m_workGroupSize.m_data[1] = 1;
      createIndirectComputeDispatchTests::s_dispatchCases[8].m_workGroupSize.m_data[2] = 2;
      std::
      vector<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ::vector(&createIndirectComputeDispatchTests::s_dispatchCases[8].m_dispatchCommands,&local_2d0
              );
      if (local_2d0.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d0.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d0.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d0.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2a0.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2a0.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_2a0.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a0.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_288.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_288.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_270.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_270.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_258.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_258.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_258.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_240.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_240.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_240.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_240.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_228.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_210.
          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.
                        super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_210.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_210.
                              super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&createIndirectComputeDispatchTests(tcu::TestContext&)::s_dispatchCases);
    }
  }
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"indirect_dispatch","Indirect dispatch tests");
  pTVar2 = (TestNode *)operator_new(0x70);
  pcVar4 = "";
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,testCtx,"upload_buffer","");
  tcu::TestNode::addChild(this,pTVar2);
  lVar5 = 0;
  do {
    pIVar3 = (IndirectDispatchCaseBufferUpload *)operator_new(0xa8);
    anon_unknown_1::IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload
              (pIVar3,testCtx,
               (DispatchCaseDesc *)
               ((long)&((DispatchCaseDesc *)
                       (&createIndirectComputeDispatchTests::s_dispatchCases[0].m_workGroupSize + -2
                       ))->m_name + lVar5),(GLSLVersion)pcVar4);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x240);
  pTVar2 = (TestNode *)operator_new(0x70);
  pcVar4 = "";
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,testCtx,"gen_in_compute","");
  tcu::TestNode::addChild(this,pTVar2);
  lVar5 = 0;
  do {
    pIVar3 = (IndirectDispatchCaseBufferUpload *)operator_new(0xa8);
    anon_unknown_1::IndirectDispatchCaseBufferUpload::IndirectDispatchCaseBufferUpload
              (pIVar3,testCtx,
               (DispatchCaseDesc *)
               ((long)&((DispatchCaseDesc *)
                       (&createIndirectComputeDispatchTests::s_dispatchCases[0].m_workGroupSize + -2
                       ))->m_name + lVar5),(GLSLVersion)pcVar4);
    (pIVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__IndirectDispatchCaseBufferUpload_00d2c4a8;
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar3);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x240);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createIndirectComputeDispatchTests (tcu::TestContext& testCtx)
{
	static const DispatchCaseDesc s_dispatchCases[] =
	{
		DispatchCaseDesc("single_invocation", "Single invocation only from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)))
        ),
		DispatchCaseDesc("multiple_groups", "Multiple groups dispatched from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(2, 3, 5)))
		),
		DispatchCaseDesc("multiple_groups_multiple_invocations", "Multiple groups of size 2x3x1 from offset 0", INDIRECT_COMMAND_OFFSET, tcu::UVec3(2, 3, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 2, 3)))
		),
		DispatchCaseDesc("small_offset", "Small offset", 16 + INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(16, tcu::UVec3(1, 1, 1)))
		),
		DispatchCaseDesc("large_offset", "Large offset", (2 << 20), tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand((1 << 20) + 12, tcu::UVec3(1, 1, 1)))
		),
		DispatchCaseDesc("large_offset_multiple_invocations", "Large offset, multiple invocations", (2 << 20), tcu::UVec3(2, 3, 1),
			commandsVec(DispatchCommand((1 << 20) + 12, tcu::UVec3(1, 2, 3)))
		),
		DispatchCaseDesc("empty_command", "Empty command", INDIRECT_COMMAND_OFFSET, tcu::UVec3(1, 1, 1),
			commandsVec(DispatchCommand(0, tcu::UVec3(0, 0, 0)))
		),
		DispatchCaseDesc("multi_dispatch", "Dispatch multiple compute commands from single buffer", 1 << 10, tcu::UVec3(3, 1, 2),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(INDIRECT_COMMAND_OFFSET, tcu::UVec3(2, 1, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(40, tcu::UVec3(1, 1, 7)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)))
		),
		DispatchCaseDesc("multi_dispatch_reuse_command", "Dispatch multiple compute commands from single buffer", 1 << 10, tcu::UVec3(3, 1, 2),
			commandsVec(DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(0, tcu::UVec3(1, 1, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(104, tcu::UVec3(1, 3, 1)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)),
						DispatchCommand(52, tcu::UVec3(1, 1, 4)))
		),
	};

	de::MovePtr<tcu::TestCaseGroup> indirectComputeDispatchTests(new tcu::TestCaseGroup(testCtx, "indirect_dispatch", "Indirect dispatch tests"));

	tcu::TestCaseGroup* const	groupBufferUpload = new tcu::TestCaseGroup(testCtx, "upload_buffer", "");
	indirectComputeDispatchTests->addChild(groupBufferUpload);

	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_dispatchCases); ndx++)
	{
		groupBufferUpload->addChild(new IndirectDispatchCaseBufferUpload(testCtx, s_dispatchCases[ndx], glu::GLSL_VERSION_310_ES));
	}

	tcu::TestCaseGroup* const	groupBufferGenerate = new tcu::TestCaseGroup(testCtx, "gen_in_compute", "");
	indirectComputeDispatchTests->addChild(groupBufferGenerate);

	for (deUint32 ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_dispatchCases); ndx++)
	{
		groupBufferGenerate->addChild(new IndirectDispatchCaseBufferGenerate(testCtx, s_dispatchCases[ndx], glu::GLSL_VERSION_310_ES));
	}

	return indirectComputeDispatchTests.release();
}